

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O2

string * opn(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  size_type sVar2;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  temp;
  string tok;
  
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>(&temp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while (lVar1 = std::__cxx11::string::find((char)str,0x20), lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&tok,(ulong)str);
    helper(&tok,&temp,__return_storage_ptr__);
    std::__cxx11::string::erase((ulong)str,0);
    std::__cxx11::string::~string((string *)&tok);
  }
  helper(str,&temp,__return_storage_ptr__);
  while (sVar2 = std::
                 deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&temp.c), 1 < sVar2) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&temp.c);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&temp.c);
  return __return_storage_ptr__;
}

Assistant:

string opn (string str) {
    stack<string> temp;
    size_t  pos = 0;
    string res;
    while ((pos = str.find(' ')) != string::npos){  // получаем подстроку от начала до первого пробела
        string tok = str.substr(0, pos);
        helper(tok, temp, res);
        str.erase(0, pos + 1);
    }
    helper(str, temp, res);  // в конце строки нет пробела
    while (temp.size() > 1) {  // считываем стек в строку
        res += temp.top();
        res += " ";
        temp.pop();
    }
    res += temp.top();
    return res;
}